

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::RenderDragDropTargetRect(ImRect *bb,ImRect *item_clip_rect)

{
  ImGuiWindow *pIVar1;
  ImDrawList *this;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  bool bVar8;
  ImU32 col;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  ImVec2 local_48;
  ImVec2 IStack_40;
  ImVec4 local_38;
  
  pIVar1 = GImGui->CurrentWindow;
  local_48.x = (bb->Min).x;
  local_48.y = (bb->Min).y;
  IStack_40.x = (bb->Max).x;
  IStack_40.y = (bb->Max).y;
  fVar2 = (item_clip_rect->Min).x;
  fVar3 = (item_clip_rect->Min).y;
  fVar4 = (item_clip_rect->Max).x;
  fVar5 = (item_clip_rect->Max).y;
  uVar9 = -(uint)(fVar2 <= local_48.x);
  uVar10 = -(uint)(fVar3 <= local_48.y);
  uVar11 = -(uint)(IStack_40.x < fVar4);
  uVar12 = -(uint)(IStack_40.y < fVar5);
  local_48.x = (float)(~uVar9 & (uint)fVar2 | (uint)local_48.x & uVar9) + -3.5;
  local_48.y = (float)(~uVar10 & (uint)fVar3 | (uint)local_48.y & uVar10) + -3.5;
  IStack_40.x = (float)(~uVar11 & (uint)fVar4 | (uint)IStack_40.x & uVar11) + 3.5;
  IStack_40.y = (float)(~uVar12 & (uint)fVar5 | (uint)IStack_40.y & uVar12) + 3.5;
  if ((((local_48.x < (pIVar1->ClipRect).Min.x) || (local_48.y < (pIVar1->ClipRect).Min.y)) ||
      ((pIVar1->ClipRect).Max.x < IStack_40.x)) ||
     (bVar8 = true, (pIVar1->ClipRect).Max.y < IStack_40.y)) {
    ImDrawList::PushClipRectFullScreen(pIVar1->DrawList);
    bVar8 = false;
  }
  this = pIVar1->DrawList;
  local_38.x = (GImGui->Style).Colors[0x33].x;
  local_38.y = (GImGui->Style).Colors[0x33].y;
  uVar6 = (GImGui->Style).Colors[0x33].z;
  uVar7 = (GImGui->Style).Colors[0x33].w;
  local_38.w = (GImGui->Style).Alpha * (float)uVar7;
  local_38.z = (float)uVar6;
  col = ColorConvertFloat4ToU32(&local_38);
  ImDrawList::AddRect(this,&local_48,&IStack_40,col,0.0,0,2.0);
  if (!bVar8) {
    ImDrawList::PopClipRect(pIVar1->DrawList);
  }
  return;
}

Assistant:

void ImGui::RenderDragDropTargetRect(const ImRect& bb, const ImRect& item_clip_rect)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    ImRect bb_display = bb;
    bb_display.ClipWith(item_clip_rect); // Clip THEN expand so we have a way to visualize that target is not entirely visible.
    bb_display.Expand(3.5f);
    bool push_clip_rect = !window->ClipRect.Contains(bb_display);
    if (push_clip_rect)
        window->DrawList->PushClipRectFullScreen();
    window->DrawList->AddRect(bb_display.Min, bb_display.Max, GetColorU32(ImGuiCol_DragDropTarget), 0.0f, 0, 2.0f);
    if (push_clip_rect)
        window->DrawList->PopClipRect();
}